

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_read_write_null_arguments(void)

{
  uv_buf_t uVar1;
  uv_buf_t uVar2;
  uv_buf_t uVar3;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  uv_buf_t uVar7;
  
  iVar4 = uv_fs_read(0,&read_req,0,0,0,0xffffffffffffffff,0);
  if (iVar4 == -0x16) {
    uv_fs_req_cleanup(&read_req);
    iVar4 = uv_fs_write(0,&write_req,0,0,0,0xffffffffffffffff,0);
    uVar3.len = iov.len;
    uVar3.base = iov.base;
    uVar2.len = iov.len;
    uVar2.base = iov.base;
    uVar1.len = iov.len;
    uVar1.base = iov.base;
    uVar7.len = iov.len;
    uVar7.base = iov.base;
    if (iVar4 == -0x16) {
      if (write_req.path == (char *)0x0) {
        if (write_req.ptr == (void *)0x0) {
          if (write_req.new_path == (char *)0x0) {
            if (write_req.bufs == (uv_buf_t *)0x0) {
              uv_fs_req_cleanup(&write_req);
              iov = (uv_buf_t)uv_buf_init(0,0);
              iVar4 = uv_fs_read(0,&read_req,0,&iov,0,0xffffffffffffffff,0);
              if (iVar4 == -0x16) {
                uv_fs_req_cleanup(&read_req);
                uVar7 = (uv_buf_t)uv_buf_init(0,0);
                iov = uVar7;
                iVar4 = uv_fs_write(0,&write_req,0,&iov,0,0xffffffffffffffff,0);
                if (iVar4 == -0x16) {
                  uv_fs_req_cleanup(&write_req);
                  loop = (uv_loop_t *)uv_default_loop();
                  iVar4 = uv_fs_read(loop,&read_req,0,0,0,0xffffffffffffffff,fail_cb);
                  if (iVar4 == -0x16) {
                    uv_run(loop,0);
                    uv_fs_req_cleanup(&read_req);
                    iVar4 = uv_fs_write(loop,&write_req,0,0,0,0xffffffffffffffff,fail_cb);
                    if (iVar4 == -0x16) {
                      uv_run(loop,0);
                      uv_fs_req_cleanup(&write_req);
                      uVar7 = (uv_buf_t)uv_buf_init(0,0);
                      iov = uVar7;
                      iVar4 = uv_fs_read(loop,&read_req,0,&iov,0,0xffffffffffffffff,fail_cb);
                      if (iVar4 == -0x16) {
                        uv_run(loop,0);
                        uv_fs_req_cleanup(&read_req);
                        uVar7 = (uv_buf_t)uv_buf_init(0,0);
                        iov = uVar7;
                        iVar4 = uv_fs_write(loop,&write_req,0,&iov,0,0xffffffffffffffff,fail_cb);
                        if (iVar4 == -0x16) {
                          uv_run(loop,0);
                          uv_fs_req_cleanup(&write_req);
                          return 0;
                        }
                        pcVar6 = "r == UV_EINVAL";
                        uVar5 = 0xe14;
                      }
                      else {
                        pcVar6 = "r == UV_EINVAL";
                        uVar5 = 0xe0e;
                      }
                    }
                    else {
                      pcVar6 = "r == UV_EINVAL";
                      uVar5 = 0xe08;
                    }
                  }
                  else {
                    pcVar6 = "r == UV_EINVAL";
                    uVar5 = 0xe03;
                  }
                }
                else {
                  pcVar6 = "r == UV_EINVAL";
                  uVar5 = 0xdfc;
                }
              }
              else {
                pcVar6 = "r == UV_EINVAL";
                uVar5 = 0xdf7;
              }
            }
            else {
              pcVar6 = "write_req.bufs == NULL";
              uVar5 = 0xdf1;
              iov = uVar7;
            }
          }
          else {
            pcVar6 = "write_req.new_path == NULL";
            uVar5 = 0xdf0;
            iov = uVar1;
          }
        }
        else {
          pcVar6 = "write_req.ptr == NULL";
          uVar5 = 0xdea;
          iov = uVar2;
        }
      }
      else {
        pcVar6 = "write_req.path == NULL";
        uVar5 = 0xde9;
        iov = uVar3;
      }
    }
    else {
      pcVar6 = "r == UV_EINVAL";
      uVar5 = 0xde8;
    }
  }
  else {
    pcVar6 = "r == UV_EINVAL";
    uVar5 = 0xde2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar5,pcVar6);
  abort();
}

Assistant:

TEST_IMPL(fs_read_write_null_arguments) {
  int r;

  r = uv_fs_read(NULL, &read_req, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_write(NULL, &write_req, 0, NULL, 0, -1, NULL);
  /* Validate some memory management on failed input validation before sending
     fs work to the thread pool. */
  ASSERT(r == UV_EINVAL);
  ASSERT(write_req.path == NULL);
  ASSERT(write_req.ptr == NULL);
#ifdef _WIN32
  ASSERT(write_req.file.pathw == NULL);
  ASSERT(write_req.fs.info.new_pathw == NULL);
  ASSERT(write_req.fs.info.bufs == NULL);
#else
  ASSERT(write_req.new_path == NULL);
  ASSERT(write_req.bufs == NULL);
#endif
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_read(NULL, &read_req, 0, &iov, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_write(NULL, &write_req, 0, &iov, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&write_req);

  /* If the arguments are invalid, the loop should not be kept open */
  loop = uv_default_loop();

  r = uv_fs_read(loop, &read_req, 0, NULL, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_write(loop, &write_req, 0, NULL, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_read(loop, &read_req, 0, &iov, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_write(loop, &write_req, 0, &iov, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&write_req);

  return 0;
}